

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

void Mvc_CoverMakeCubeFree(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  int _i_;
  uint uVar3;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  pMVar2 = (Mvc_Cube_t *)&pCover->lCubes;
  while (pMVar2 = pMVar2->pNext, pMVar2 != (Mvc_Cube_t *)0x0) {
    uVar3 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
    if (uVar3 == 0) {
      pMVar2->pData[0] = pMVar2->pData[0] & ~pCover->pMask->pData[0];
    }
    else if (uVar3 == 1) {
      pMVar1 = pCover->pMask;
      pMVar2->pData[0] = pMVar2->pData[0] & ~pMVar1->pData[0];
      *(uint *)&pMVar2->field_0x14 = *(uint *)&pMVar2->field_0x14 & ~*(uint *)&pMVar1->field_0x14;
    }
    else {
      pMVar1 = pCover->pMask;
      for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        pMVar2->pData[uVar3] = pMVar2->pData[uVar3] & ~pMVar1->pData[uVar3];
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverMakeCubeFree( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // remove this cube from the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitSharp( pCube, pCube, pCover->pMask );
}